

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  StringPiece SVar2;
  bool bVar3;
  int iVar4;
  stringpiece_ssize_type sVar5;
  long lVar6;
  pointer ppVar7;
  ostream *poVar8;
  mapped_type *this_00;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  _Self local_160;
  string local_158;
  _Self local_138;
  iterator existing_entry;
  undefined1 local_120 [8];
  StringPiece proto_file;
  int start;
  undefined1 local_f8 [8];
  StringPiece proto_file_list;
  undefined1 local_d8 [8];
  StringPiece framework_name;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int offset;
  string *out_error_local;
  StringPiece *line_local;
  ProtoFrameworkCollector *this_local;
  
  psStack_28 = out_error;
  out_error_local = (string *)line;
  line_local = (StringPiece *)this;
  sVar5 = StringPiece::find(line,':',0);
  local_2c = (int)sVar5;
  if (local_2c == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Framework/proto file mapping line without colon sign: \'",
               &local_91);
    StringPiece::ToString_abi_cxx11_
              ((string *)&framework_name.length_,(StringPiece *)out_error_local);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &framework_name.length_);
    std::operator+(&local_50,&local_70,"\'.");
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&framework_name.length_);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    this_local._7_1_ = false;
  }
  else {
    proto_file_list.length_ = *(stringpiece_ssize_type *)out_error_local;
    StringPiece::StringPiece
              ((StringPiece *)local_d8,*(StringPiece *)out_error_local,0,(long)local_2c);
    SVar2 = *(StringPiece *)out_error_local;
    iVar4 = local_2c + 1;
    sVar5 = StringPiece::length((StringPiece *)out_error_local);
    StringPiece::StringPiece((StringPiece *)local_f8,SVar2,(long)iVar4,(sVar5 - local_2c) + -1);
    StringPieceTrimWhitespace((StringPiece *)local_d8);
    proto_file.length_._4_4_ = 0;
    while (lVar6 = (long)proto_file.length_._4_4_,
          sVar5 = StringPiece::length((StringPiece *)local_f8), lVar6 < sVar5) {
      sVar5 = StringPiece::find((StringPiece *)local_f8,',',(long)proto_file.length_._4_4_);
      local_2c = (int)sVar5;
      if (local_2c == -1) {
        sVar5 = StringPiece::length((StringPiece *)local_f8);
        local_2c = (int)sVar5;
      }
      existing_entry._M_node = (_Base_ptr)local_f8;
      SVar2.length_ = (stringpiece_ssize_type)proto_file_list.ptr_;
      SVar2.ptr_ = (char *)local_f8;
      StringPiece::StringPiece
                ((StringPiece *)local_120,SVar2,(long)proto_file.length_._4_4_,
                 (long)(local_2c - proto_file.length_._4_4_));
      StringPieceTrimWhitespace((StringPiece *)local_120);
      sVar5 = StringPiece::size((StringPiece *)local_120);
      if (sVar5 != 0) {
        pmVar1 = this->map_;
        StringPiece::ToString_abi_cxx11_(&local_158,(StringPiece *)local_120);
        local_138._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(pmVar1,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        local_160._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(this->map_);
        bVar3 = std::operator!=(&local_138,&local_160);
        if (bVar3) {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "warning: duplicate proto file reference, replacing framework entry for \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_180,(StringPiece *)local_120);
          poVar8 = std::operator<<(poVar8,(string *)&local_180);
          poVar8 = std::operator<<(poVar8,"\' with \'");
          StringPiece::ToString_abi_cxx11_(&local_1a0,(StringPiece *)local_d8);
          poVar8 = std::operator<<(poVar8,(string *)&local_1a0);
          poVar8 = std::operator<<(poVar8,"\' (was \'");
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_138);
          poVar8 = std::operator<<(poVar8,(string *)&ppVar7->second);
          poVar8 = std::operator<<(poVar8,"\').");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_180);
          std::ostream::flush();
        }
        sVar5 = StringPiece::find((StringPiece *)local_120,' ',0);
        if (sVar5 != -1) {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_1c0,(StringPiece *)local_120);
          poVar8 = std::operator<<(poVar8,(string *)&local_1c0);
          poVar8 = std::operator<<(poVar8,"\'");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::ostream::flush();
        }
        StringPiece::ToString_abi_cxx11_(&local_1e0,(StringPiece *)local_d8);
        pmVar1 = this->map_;
        StringPiece::ToString_abi_cxx11_(&local_200,(StringPiece *)local_120);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](pmVar1,&local_200);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      proto_file.length_._4_4_ = local_2c + 1;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece framework_name(line, 0, offset);
  StringPiece proto_file_list(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file(proto_file_list, start, offset - start);
    StringPieceTrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      map<string, string>::iterator existing_entry =
          map_->find(proto_file.ToString());
      if (existing_entry != map_->end()) {
        cerr << "warning: duplicate proto file reference, replacing framework entry for '"
             << proto_file.ToString() << "' with '" << framework_name.ToString()
             << "' (was '" << existing_entry->second << "')." << endl;
        cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        cerr << "note: framework mapping file had a proto file with a space in, hopefully that isn't a missing comma: '"
             << proto_file.ToString() << "'" << endl;
        cerr.flush();
      }

      (*map_)[proto_file.ToString()] = framework_name.ToString();
    }

    start = offset + 1;
  }

  return true;
}